

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O3

void __thiscall
ktx::CommandExtract::saveImageFile
          (CommandExtract *this,string *filepath,bool appendExtension,char *data,size_t size,
          VkFormat vkFormat,FormatDescriptor *format,uint32_t width,uint32_t height)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  initializer_list<int> __l;
  allocator_type local_359;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  int local_38 [2];
  
  if ((int)vkFormat < 0x3b9d2b60) {
    switch(vkFormat) {
    case VK_FORMAT_R4G4_UNORM_PACK8:
    case VK_FORMAT_R4G4B4A4_UNORM_PACK16:
    case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
    case VK_FORMAT_R5G6B5_UNORM_PACK16:
    case VK_FORMAT_B5G6R5_UNORM_PACK16:
    case VK_FORMAT_R5G5B5A1_UNORM_PACK16:
    case VK_FORMAT_B5G5R5A1_UNORM_PACK16:
    case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
    case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
    case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
    case VK_FORMAT_R16_UNORM:
    case VK_FORMAT_R16G16_UNORM:
    case VK_FORMAT_R16G16B16_UNORM:
    case VK_FORMAT_R16G16B16A16_UNORM:
switchD_0018c7bc_caseD_1:
      local_98._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar1) {
        local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_98._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      savePNG(this,&local_98,appendExtension,vkFormat,format,width,height,data,size);
      local_358.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R8_UNORM:
    case VK_FORMAT_R8_SRGB:
    case VK_FORMAT_R8G8_UNORM:
    case VK_FORMAT_R8G8_SRGB:
    case VK_FORMAT_R8G8B8_UNORM:
    case VK_FORMAT_R8G8B8_SRGB:
    case VK_FORMAT_B8G8R8_UNORM:
    case VK_FORMAT_B8G8R8_SRGB:
    case VK_FORMAT_R8G8B8A8_UNORM:
    case VK_FORMAT_R8G8B8A8_SRGB:
    case VK_FORMAT_B8G8R8A8_UNORM:
    case VK_FORMAT_B8G8R8A8_SRGB:
    case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
    case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
switchD_0018c7bc_caseD_9:
      local_58._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar1) {
        local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_58.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_58._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      savePNG(this,&local_58,appendExtension,vkFormat,format,width,height,data,size);
      local_358.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_58._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return;
      }
      break;
    default:
      goto switchD_0018c7bc_caseD_a;
    case VK_FORMAT_R8_UINT:
    case VK_FORMAT_R8_SINT:
      local_d8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar1) {
        local_d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_d8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_d8,appendExtension,vkFormat,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R8G8_UINT:
    case VK_FORMAT_R8G8_SINT:
      local_138._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == paVar1) {
        local_138.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_138.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_138._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_138,appendExtension,vkFormat,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_138._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R8G8B8_UINT:
    case VK_FORMAT_R8G8B8_SINT:
    case VK_FORMAT_B8G8R8_UINT:
    case VK_FORMAT_B8G8R8_SINT:
      local_198._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar1) {
        local_198.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_198.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_198._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_198,appendExtension,vkFormat,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_198._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == &local_198.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R8G8B8A8_UINT:
    case VK_FORMAT_R8G8B8A8_SINT:
    case VK_FORMAT_B8G8R8A8_UINT:
    case VK_FORMAT_B8G8R8A8_SINT:
      local_1f8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p == paVar1) {
        local_1f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_1f8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_1f8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_1f8,appendExtension,vkFormat,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_1f8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_1f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_A2R10G10B10_UINT_PACK32:
    case VK_FORMAT_A2R10G10B10_SINT_PACK32:
    case VK_FORMAT_A2B10G10R10_UINT_PACK32:
    case VK_FORMAT_A2B10G10R10_SINT_PACK32:
      local_258._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p == paVar1) {
        local_258.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_258.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      }
      else {
        local_258.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_258._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_258,appendExtension,vkFormat,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_258._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p == &local_258.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R16_UINT:
    case VK_FORMAT_R16_SINT:
      local_f8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar1) {
        local_f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_f8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_f8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_f8,appendExtension,vkFormat,format,width,height,2,data,size);
      local_358.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R16_SFLOAT:
    case VK_FORMAT_R16G16_SFLOAT:
    case VK_FORMAT_R16G16B16_SFLOAT:
    case VK_FORMAT_R16G16B16A16_SFLOAT:
      local_278._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p == paVar1) {
        local_278.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_278.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_278._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_278,appendExtension,vkFormat,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_278.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_278._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p == &local_278.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R16G16_UINT:
    case VK_FORMAT_R16G16_SINT:
      local_158._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p == paVar1) {
        local_158.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_158.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_158._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_158,appendExtension,vkFormat,format,width,height,2,data,size);
      local_358.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_158._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p == &local_158.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R16G16B16_UINT:
    case VK_FORMAT_R16G16B16_SINT:
      local_1b8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == paVar1) {
        local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_1b8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_1b8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_1b8,appendExtension,vkFormat,format,width,height,2,data,size);
      local_358.field_2._M_allocated_capacity = local_1b8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_1b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R16G16B16A16_UINT:
    case VK_FORMAT_R16G16B16A16_SINT:
      local_218._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == paVar1) {
        local_218.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_218.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_218._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_218,appendExtension,vkFormat,format,width,height,2,data,size);
      local_358.field_2._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_218._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == &local_218.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R32_UINT:
      local_118._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == paVar1) {
        local_118.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_118.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_118._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_118,appendExtension,VK_FORMAT_R32_UINT,format,width,height,0,data,size);
      local_358.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_118._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == &local_118.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R32_SFLOAT:
    case VK_FORMAT_R32G32_SFLOAT:
    case VK_FORMAT_R32G32B32_SFLOAT:
    case VK_FORMAT_R32G32B32A32_SFLOAT:
      local_298._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p == paVar1) {
        local_298.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_298.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_298._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_298,appendExtension,vkFormat,format,width,height,2,data,size);
      local_358.field_2._M_allocated_capacity = local_298.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_298._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p == &local_298.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R32G32_UINT:
      local_178._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p == paVar1) {
        local_178.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_178.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      }
      else {
        local_178.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_178._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_178,appendExtension,VK_FORMAT_R32G32_UINT,format,width,height,0,data,size)
      ;
      local_358.field_2._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_178._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p == &local_178.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R32G32B32_UINT:
      local_1d8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p == paVar1) {
        local_1d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_1d8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_1d8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_1d8,appendExtension,VK_FORMAT_R32G32B32_UINT,format,width,height,0,data,
              size);
      local_358.field_2._M_allocated_capacity = local_1d8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_1d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_R32G32B32A32_UINT:
      local_238._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p == paVar1) {
        local_238.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_238.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      }
      else {
        local_238.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_238._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_238,appendExtension,VK_FORMAT_R32G32B32A32_UINT,format,width,height,0,data
              ,size);
      local_358.field_2._M_allocated_capacity = local_238.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_238._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p == &local_238.field_2) {
        return;
      }
      break;
    case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
      local_2b8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == paVar1) {
        local_2b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_2b8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_2b8,appendExtension,vkFormat,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_2b8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_2b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_D16_UNORM:
      local_2d8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p == paVar1) {
        local_2d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_2d8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_2d8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      savePNG(this,&local_2d8,appendExtension,VK_FORMAT_D16_UNORM,format,width,height,data,size);
      local_358.field_2._M_allocated_capacity = local_2d8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_2d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p == &local_2d8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_X8_D24_UNORM_PACK32:
    case VK_FORMAT_D32_SFLOAT:
      local_2f8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p == paVar1) {
        local_2f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_2f8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      }
      else {
        local_2f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_2f8._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_2f8,appendExtension,vkFormat,format,width,height,2,data,size);
      local_358.field_2._M_allocated_capacity = local_2f8.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_2f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p == &local_2f8.field_2) {
        return;
      }
      break;
    case VK_FORMAT_S8_UINT:
      local_318._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p == paVar1) {
        local_318.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_318.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      }
      else {
        local_318.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_318._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      saveEXR(this,&local_318,appendExtension,VK_FORMAT_S8_UINT,format,width,height,1,data,size);
      local_358.field_2._M_allocated_capacity = local_318.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_318._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p == &local_318.field_2) {
        return;
      }
      break;
    case VK_FORMAT_D16_UNORM_S8_UINT:
    case VK_FORMAT_D24_UNORM_S8_UINT:
    case VK_FORMAT_D32_SFLOAT_S8_UINT:
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if (paVar2 == paVar1) {
        local_338.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_338.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
      }
      else {
        local_338.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_338._M_dataplus._M_p = (pointer)paVar2;
      }
      local_338._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      local_38[0] = 2;
      local_38[1] = 1;
      __l._M_len = 2;
      __l._M_array = local_38;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_358,__l,&local_359);
      saveEXR(this,&local_338,appendExtension,vkFormat,format,width,height,
              (vector<int,_std::allocator<int>_> *)&local_358,data,size);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_358._M_dataplus._M_p,
                        local_358.field_2._M_allocated_capacity - (long)local_358._M_dataplus._M_p);
      }
      local_358.field_2._M_allocated_capacity = local_338.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_338._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p == &local_338.field_2) {
        return;
      }
      break;
    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:
    case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:
    case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:
    case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:
    case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
      local_78._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
      paVar1 = &filepath->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar1) {
        local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_78.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_78._M_string_length = filepath->_M_string_length;
      (filepath->_M_dataplus)._M_p = (pointer)paVar1;
      filepath->_M_string_length = 0;
      (filepath->field_2)._M_local_buf[0] = '\0';
      decodeAndSaveASTC(this,&local_78,appendExtension,vkFormat,format,width,height,data,size);
      local_358.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      local_358._M_dataplus._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return;
      }
    }
  }
  else {
    if ((int)vkFormat < 0x3b9ffa20) {
      uVar3 = vkFormat + 0xc462d4a0;
      if (uVar3 < 0x1d) {
        if ((0x18300c03U >> (uVar3 & 0x1f) & 1) != 0) {
          local_b8._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
          paVar1 = &filepath->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p == paVar1) {
            local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_b8.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          }
          local_b8._M_string_length = filepath->_M_string_length;
          (filepath->_M_dataplus)._M_p = (pointer)paVar1;
          filepath->_M_string_length = 0;
          (filepath->field_2)._M_local_buf[0] = '\0';
          unpackAndSave422(this,&local_b8,appendExtension,(VkFormat)paVar1,format,width,height,data,
                           size);
          local_358.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
          local_358._M_dataplus._M_p = local_b8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
            return;
          }
          goto LAB_0018d664;
        }
        if ((0xe0380U >> (uVar3 & 0x1f) & 1) != 0) goto switchD_0018c7bc_caseD_1;
      }
    }
    else {
      if ((vkFormat + 0xc46005e0 < 2) || (vkFormat == VK_FORMAT_A1B5G5R5_UNORM_PACK16_KHR))
      goto switchD_0018c7bc_caseD_1;
      if (vkFormat == VK_FORMAT_A8_UNORM_KHR) goto switchD_0018c7bc_caseD_9;
    }
switchD_0018c7bc_caseD_a:
    toString_abi_cxx11_(&local_358,(ktx *)(ulong)vkFormat,
                        (VkFormat)CONCAT71(in_register_00000011,appendExtension));
    Reporter::fatal<char_const(&)[54],std::__cxx11::string>
              (&(this->super_Command).super_Reporter,INVALID_FILE,
               (char (*) [54])"Requested format conversion from {} is not supported.",&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p == &local_358.field_2) {
      return;
    }
  }
LAB_0018d664:
  operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void CommandExtract::saveImageFile(
        std::string filepath, bool appendExtension,
        const char* data, std::size_t size,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height) {

    switch (vkFormat) {
    case VK_FORMAT_A8_UNORM_KHR: [[fallthrough]];
    case VK_FORMAT_R8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8_SRGB: [[fallthrough]];
    case VK_FORMAT_R8G8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8_SRGB: [[fallthrough]];
    case VK_FORMAT_R8G8B8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8_SRGB: [[fallthrough]];
    case VK_FORMAT_B8G8R8_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8_SRGB: [[fallthrough]];
    case VK_FORMAT_A8B8G8R8_UNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_A8B8G8R8_SRGB_PACK32: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_SRGB: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_SRGB:
        savePNG(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
        // ASTC decode will recurse into this function with the uncompressed data and format
        decodeAndSaveASTC(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_R4G4_UNORM_PACK8: [[fallthrough]];
    case VK_FORMAT_R5G6B5_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_B5G6R5_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R4G4B4A4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_B4G4R4A4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R5G5B5A1_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_B5G5R5A1_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_A1R5G5B5_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_A1B5G5R5_UNORM_PACK16_KHR: [[fallthrough]];
    case VK_FORMAT_A4R4G4B4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_A4B4G4R4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R10X6_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R10X6G10X6_UNORM_2PACK16: [[fallthrough]];
    case VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_R12X4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R12X4G12X4_UNORM_2PACK16: [[fallthrough]];
    case VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_R16_UNORM: [[fallthrough]];
    case VK_FORMAT_R16G16_UNORM: [[fallthrough]];
    case VK_FORMAT_R16G16B16_UNORM: [[fallthrough]];
    case VK_FORMAT_R16G16B16A16_UNORM: [[fallthrough]];
    case VK_FORMAT_A2R10G10B10_UNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
        savePNG(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_G8B8G8R8_422_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8G8_422_UNORM: [[fallthrough]];
    case VK_FORMAT_G10X6B10X6G10X6R10X6_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_B10X6G10X6R10X6G10X6_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_G12X4B12X4G12X4R12X4_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_B12X4G12X4R12X4G12X4_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_G16B16G16R16_422_UNORM: [[fallthrough]];
    case VK_FORMAT_B16G16R16G16_422_UNORM:
        // Unpack and save 4:2:2 formats as UNORM8, UNORM10X6, UNORM12X4 or UNORM16 formats
        unpackAndSave422(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    // EXR

    case VK_FORMAT_R8_UINT: [[fallthrough]];
    case VK_FORMAT_R8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16_UINT: [[fallthrough]];
    case VK_FORMAT_R16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;
    case VK_FORMAT_R8G8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16G16_UINT: [[fallthrough]];
    case VK_FORMAT_R16G16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32G32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;
    case VK_FORMAT_R8G8B8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8B8_SINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8_UINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16G16B16_UINT: [[fallthrough]];
    case VK_FORMAT_R16G16B16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32G32B32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;
    case VK_FORMAT_R8G8B8A8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_SINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_UINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16G16B16A16_UINT: [[fallthrough]];
    case VK_FORMAT_R16G16B16A16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32G32B32A32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;

    case VK_FORMAT_A2R10G10B10_UINT_PACK32: [[fallthrough]];
    case VK_FORMAT_A2R10G10B10_SINT_PACK32: [[fallthrough]];
    case VK_FORMAT_A2B10G10R10_UINT_PACK32: [[fallthrough]];
    case VK_FORMAT_A2B10G10R10_SINT_PACK32:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;

    case VK_FORMAT_R16_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R16G16_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R16G16B16_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R16G16B16A16_SFLOAT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R32_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R32G32_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R32G32B32_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R32G32B32A32_SFLOAT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;

    case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;

    case VK_FORMAT_D16_UNORM:
        savePNG(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_X8_D24_UNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_D32_SFLOAT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_S8_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_D16_UNORM_S8_UINT: [[fallthrough]];
    case VK_FORMAT_D24_UNORM_S8_UINT: [[fallthrough]];
    case VK_FORMAT_D32_SFLOAT_S8_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, {TINYEXR_PIXELTYPE_FLOAT, TINYEXR_PIXELTYPE_HALF}, data, size);
        break;

    default:
        fatal(rc::INVALID_FILE, "Requested format conversion from {} is not supported.", toString(vkFormat));
    }
}